

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::PropertyDeclarationSyntax::PropertyDeclarationSyntax
          (PropertyDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,Token name,
          AssertionItemPortListSyntax *portList,Token semi,
          SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *variables,
          PropertySpecSyntax *propertySpec,Token optionalSemi,Token end,
          NamedBlockClauseSyntax *endBlockName)

{
  size_type sVar1;
  pointer ppAVar2;
  pointer ppLVar3;
  SyntaxKind SVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  
  uVar8 = name._0_8_;
  uVar6 = keyword._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = PropertyDeclaration;
  SVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->keyword).kind = (short)uVar6;
  (this->keyword).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->keyword).info = keyword.info;
  (this->name).kind = (short)uVar8;
  (this->name).field_0x2 = (char)((ulong)uVar8 >> 0x10);
  (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar8 >> 0x18);
  (this->name).rawLen = (int)((ulong)uVar8 >> 0x20);
  (this->name).info = name.info;
  this->portList = portList;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  SVar4 = (variables->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(variables->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->variables).super_SyntaxListBase.super_SyntaxNode.parent =
       (variables->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->variables).super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)&(this->variables).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->variables).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->variables).super_SyntaxListBase.childCount = (variables->super_SyntaxListBase).childCount;
  sVar1 = (variables->
          super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>).size_
  ;
  (this->variables).
  super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>.data_ =
       (variables->
       super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>).data_;
  (this->variables).
  super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->variables).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ed9e0
  ;
  (this->propertySpec).ptr = propertySpec;
  (this->optionalSemi).kind = optionalSemi.kind;
  (this->optionalSemi).field_0x2 = optionalSemi._2_1_;
  (this->optionalSemi).numFlags = (NumericTokenFlags)optionalSemi.numFlags.raw;
  (this->optionalSemi).rawLen = optionalSemi.rawLen;
  (this->optionalSemi).info = optionalSemi.info;
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  (this->end).info = end.info;
  this->endBlockName = endBlockName;
  if (portList != (AssertionItemPortListSyntax *)0x0) {
    (portList->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->variables).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->variables).
          super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppLVar3 = (this->variables).
              super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>.
              data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppLVar3 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (propertySpec->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

PropertyDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token name, AssertionItemPortListSyntax* portList, Token semi, const SyntaxList<LocalVariableDeclarationSyntax>& variables, PropertySpecSyntax& propertySpec, Token optionalSemi, Token end, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::PropertyDeclaration, attributes), keyword(keyword), name(name), portList(portList), semi(semi), variables(variables), propertySpec(&propertySpec), optionalSemi(optionalSemi), end(end), endBlockName(endBlockName) {
        if (this->portList) this->portList->parent = this;
        this->variables.parent = this;
        for (auto child : this->variables)
            child->parent = this;
        this->propertySpec->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }